

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

void token_copy(token_t *from,token_t *to)

{
  undefined4 *in_RSI;
  undefined4 *in_RDI;
  
  *in_RSI = *in_RDI;
  in_RSI[1] = in_RDI[1];
  in_RSI[2] = in_RDI[2];
  in_RSI[3] = in_RDI[3];
  in_RSI[4] = in_RDI[4];
  in_RSI[5] = in_RDI[5];
  strcpy((char *)(in_RSI + 6),(char *)(in_RDI + 6));
  return;
}

Assistant:

void token_copy(token_t* from, token_t* to)
{
    to->id = from->id;
    to->line = from->line;
    to->column = from->column;
    to->constant = from->constant;
    to->_unsigned = from->_unsigned;
    to->_word = from->_word;
    strcpy(to->string, from->string);
}